

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateNVSMOrARMCoreBuiltinsAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  BuiltIn operand;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  AssemblyGrammar *this_00;
  mapped_type *this_01;
  BuiltInsValidator *local_410;
  code *local_408;
  undefined8 local_400;
  type local_3f8;
  value_type local_2a8;
  uint32_t local_284;
  string local_280;
  string local_260;
  char *local_240;
  string local_238;
  DiagnosticStream local_218;
  StorageClass local_3c;
  Instruction *pIStack_38;
  StorageClass storage_class;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_38 = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (((bVar1) && (local_3c = GetStorageClass(pIStack_38), local_3c != Max)) && (local_3c != Input))
  {
    ValidationState_t::diag(&local_218,this->_,SPV_ERROR_INVALID_DATA,pIStack_38);
    psVar2 = ValidationState_t::context(this->_);
    spvLogStringForEnv_abi_cxx11_(&local_238,psVar2->target_env);
    pDVar3 = DiagnosticStream::operator<<(&local_218,&local_238);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [22])0x61f01a);
    this_00 = ValidationState_t::grammar(this->_);
    operand = Decoration::builtin((Decoration *)built_in_inst_local);
    local_240 = AssemblyGrammar::lookupOperandName(this_00,SPV_OPERAND_TYPE_BUILT_IN,operand);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_240);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [58])0x621107);
    (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
              (&local_260,this,(Decoration *)built_in_inst_local,referenced_inst_local,
               referenced_from_inst_local,pIStack_38,Max);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_260);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x634f49);
    (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
              (&local_280,this,pIStack_38);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_280);
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    DiagnosticStream::~DiagnosticStream(&local_218);
  }
  else {
    if (this->function_id_ == 0) {
      local_284 = Instruction::id(pIStack_38);
      this_01 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,&local_284);
      local_408 = ValidateNVSMOrARMCoreBuiltinsAtReference;
      local_400 = 0;
      local_410 = this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                (&local_3f8,(offset_in_BuiltInsValidator_to_subr *)&local_408,&local_410,
                 (Decoration *)built_in_inst_local,referenced_inst_local,pIStack_38,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2a8,&local_3f8)
      ;
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(this_01,&local_2a8);
      std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2a8);
      std::
      _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
      ::~_Bind(&local_3f8);
    }
    this_local._4_4_ = SPV_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateNVSMOrARMCoreBuiltinsAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              (uint32_t)decoration.builtin())
             << " to be only used for "
                "variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateNVSMOrARMCoreBuiltinsAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}